

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManExplore2(Sbd_Man_t *p,int Pivot,word *pTruth)

{
  uint nCol;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  sat_solver *psVar6;
  ulong uVar7;
  word wVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  timespec ts;
  word CoverRows [64];
  word CoverCols [64];
  word Offset [64];
  word Onset [64];
  timespec local_870;
  uint local_860;
  int local_85c;
  word *local_858;
  ulong local_850;
  long local_848;
  ulong local_840;
  ulong local_838 [64];
  word local_638 [64];
  word local_438 [64];
  word local_238 [65];
  
  uVar9 = (ulong)(uint)Pivot;
  local_858 = pTruth;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  memset(local_838,0,0x200);
  memset(local_638,0,0x200);
  if ((Pivot < 0) || (p->vObj2Var->nSize <= Pivot)) {
LAB_0054430c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  local_85c = p->vObj2Var->pArray[uVar9];
  local_840 = (ulong)(uint)(p->vTfo->nSize + p->vWinObjs->nSize + p->vRoots->nSize);
  nCol = p->vDivVars->nSize;
  uVar5 = (ulong)nCol;
  iVar2 = clock_gettime(3,&local_870);
  if (iVar2 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
  }
  psVar6 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar6;
  iVar2 = clock_gettime(3,&local_870);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar11 + lVar10;
  iVar2 = clock_gettime(3,&local_870);
  if (iVar2 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
  }
  uVar3 = Sbd_ManCollectConstantsNew(p->pSat,p->vDivVars,4,local_85c,local_238,local_438);
  iVar2 = clock_gettime(3,&local_870);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar11 + lVar10;
  if ((int)uVar3 < 0) {
    local_848 = (long)(int)nCol;
    lVar10 = 0;
    uVar3 = 0;
    local_860 = Pivot;
    do {
      uVar9 = local_238[lVar10];
      lVar11 = 0;
      do {
        if (uVar9 == local_438[lVar11]) {
          __assert_fail("Cube",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x4b9,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
        }
        if (0x100 < (int)uVar3) {
          __assert_fail("nRows <= nRowLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                        ,0x353,"int Sbd_ManAddCube1(int, word *, int, word)");
        }
        uVar7 = local_438[lVar11] ^ uVar9;
        if ((int)uVar3 < 1) {
          uVar14 = 0;
LAB_00543c8c:
          lVar13 = (long)(int)uVar14;
          uVar14 = uVar14 + 1;
          local_838[lVar13] = uVar7;
        }
        else {
          uVar12 = 0;
          do {
            uVar14 = uVar3;
            if ((local_838[uVar12] & ~uVar7) == 0) goto LAB_00543cc1;
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
          uVar12 = 0;
          uVar14 = 0;
          do {
            if ((uVar7 & ~local_838[uVar12]) != 0) {
              lVar13 = (long)(int)uVar14;
              uVar14 = uVar14 + 1;
              local_838[lVar13] = local_838[uVar12];
            }
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
          if ((int)uVar14 < 0x100) goto LAB_00543c8c;
        }
        if ((int)uVar14 < (int)uVar3) {
          memset(local_838 + (int)uVar14,0,(ulong)(uVar3 + ~uVar14) * 8 + 8);
        }
LAB_00543cc1:
        uVar3 = uVar14;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    if (0x40 < (int)uVar3) {
      __assert_fail("nRows <= 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                    ,0x4bc,"int Sbd_ManExplore2(Sbd_Man_t *, int, word *)");
    }
    if (0 < (int)uVar3) {
      uVar9 = 0;
      do {
        if (-1 < (int)nCol) {
          uVar7 = local_838[uVar9];
          uVar12 = 0;
          do {
            if ((uVar7 >> (uVar12 & 0x3f) & 1) != 0) {
              local_638[(uVar9 >> 6) + uVar12] =
                   local_638[(uVar9 >> 6) + uVar12] ^ 1L << ((byte)uVar9 & 0x3f);
            }
            uVar12 = uVar12 + 1;
          } while (nCol + 1 != uVar12);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
      if (uVar3 == 0x40) {
        return 0;
      }
    }
    uVar9 = 0;
    while( true ) {
      if (p->pPars->fVeryVerbose != 0) {
        Sbd_ManMatrPrint(p,local_638,nCol,uVar3);
      }
      iVar2 = clock_gettime(3,&local_870);
      if (iVar2 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
      }
      iVar2 = Sbd_ManFindCands(p,local_638,nCol);
      if (iVar2 == 0) break;
      iVar2 = clock_gettime(3,&local_870);
      if (iVar2 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
      }
      p->timeCov = p->timeCov + lVar11 + lVar10;
      if (p->pPars->fVeryVerbose != 0) {
        printf("Candidate support:  ");
        pVVar1 = p->vDivSet;
        printf("Vector has %d entries: {",(ulong)(uint)pVVar1->nSize);
        if (0 < pVVar1->nSize) {
          lVar10 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar1->pArray[lVar10]);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar1->nSize);
        }
        puts(" }");
      }
      iVar2 = clock_gettime(3,&local_870);
      if (iVar2 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_870.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_870.tv_sec * -1000000;
      }
      wVar8 = Sbd_ManSolve(p->pSat,local_85c,(int)local_840 + (int)uVar9,p->vDivSet,p->vDivVars,
                           p->vDivValues,p->vLits);
      *local_858 = wVar8;
      iVar2 = clock_gettime(3,&local_870);
      if (iVar2 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar11 + lVar10;
      if (*local_858 == 0x8765432187654321) {
        if (p->pPars->fVeryVerbose != 0) {
          printf("Node %d:  SAT.\n",(ulong)local_860);
          if ((int)nCol < 1) {
            putchar(10);
LAB_0054415a:
            putchar(10);
LAB_00544164:
            putchar(10);
          }
          else {
            uVar7 = 0;
            do {
              if ((long)p->vDivVars->nSize <= (long)uVar7) goto LAB_0054430c;
              iVar2 = p->vDivVars->pArray[uVar7];
              if (((long)iVar2 < 0) || (p->vWinObjs->nSize <= iVar2)) goto LAB_0054430c;
              iVar2 = p->vWinObjs->pArray[iVar2];
              if (((long)iVar2 < 0) || (p->vLutLevs->nSize <= iVar2)) goto LAB_0054430c;
              printf("%d",(ulong)(uint)p->vLutLevs->pArray[iVar2]);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
            putchar(10);
            if ((int)nCol < 1) goto LAB_0054415a;
            uVar12 = 0;
            uVar7 = uVar5;
            local_850 = uVar9;
            do {
              printf("%d",(ulong)(uint)((int)uVar12 + (int)(uVar12 / 10) * -10));
              uVar12 = (ulong)((int)uVar12 + 1);
              uVar14 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar14;
            } while (uVar14 != 0);
            putchar(10);
            uVar9 = local_850;
            if ((int)nCol < 1) goto LAB_00544164;
            uVar7 = 0;
            do {
              if ((long)p->vDivValues->nSize <= (long)uVar7) goto LAB_0054430c;
              uVar14 = p->vDivValues->pArray[uVar7];
              uVar4 = 0x78;
              if ((uVar14 & 4) != 0) {
                uVar4 = uVar14 & 1 | 0x30;
              }
              putchar(uVar4);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
            putchar(10);
            if (0 < (int)nCol) {
              uVar7 = 0;
              do {
                if ((long)p->vDivValues->nSize <= (long)uVar7) goto LAB_0054430c;
                uVar14 = p->vDivValues->pArray[uVar7];
                uVar4 = uVar14 >> 1 & 1 | 0x30;
                if ((uVar14 & 8) == 0) {
                  uVar4 = 0x78;
                }
                putchar(uVar4);
                uVar7 = uVar7 + 1;
              } while (uVar5 != uVar7);
            }
          }
          putchar(10);
        }
        if ((int)nCol < 1) {
          uVar7 = 1L << ((byte)uVar3 & 0x3f);
        }
        else {
          pVVar1 = p->vDivValues;
          uVar14 = pVVar1->nSize;
          uVar7 = 1L << ((byte)uVar3 & 0x3f);
          if ((int)uVar14 < 1) {
            uVar14 = 0;
          }
          uVar12 = 0;
          do {
            if (uVar14 == uVar12) goto LAB_0054430c;
            if (pVVar1->pArray[uVar12] - 0xdU < 2) {
              local_638[uVar12] = local_638[uVar12] | uVar7;
            }
            uVar12 = uVar12 + 1;
          } while (uVar5 != uVar12);
        }
        local_638[local_848] = local_638[local_848] | uVar7;
        uVar3 = uVar3 + 1;
      }
      else {
        if (*local_858 != 0x1234567812345678) {
          if (p->pPars->fVeryVerbose != 0) {
            printf("Node %d:  UNSAT.   ",(ulong)local_860);
            Extra_PrintBinary(_stdout,(uint *)local_858,1 << ((byte)p->vDivSet->nSize & 0x1f));
            putchar(10);
          }
          p->nLuts[1] = p->nLuts[1] + 1;
          return 1;
        }
        printf("Node %d:  Undecided.\n",(ulong)local_860);
      }
      if (0x1e < (uint)uVar9) {
        return 0;
      }
      uVar9 = (ulong)((uint)uVar9 + 1);
      if (0x3f < (int)uVar3) {
        return 0;
      }
    }
    if (p->pPars->fVeryVerbose != 0) {
      puts("Cannot find a feasible cover.");
    }
    iVar2 = clock_gettime(3,&local_870);
    if (iVar2 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_870.tv_nsec / 1000 + local_870.tv_sec * 1000000;
    }
    p->timeCov = p->timeCov + lVar11 + lVar10;
    uVar3 = 0;
  }
  else {
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)uVar3,uVar9);
    }
    if (p->vLutLevs->nSize <= Pivot) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vLutLevs->pArray[uVar9] = 0;
    p->nLuts[0] = p->nLuts[0] + 1;
  }
  return uVar3;
}

Assistant:

int Sbd_ManExplore2( Sbd_Man_t * p, int Pivot, word * pTruth )
{
    abctime clk;
    word Onset[64] = {0}, Offset[64] = {0}, Cube;
    word CoverRows[64] = {0}, CoverCols[64] = {0};
    int nIters, nItersMax = 32;
    int i, k, nRows = 0;

    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(p->vWinObjs) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots);
    int nDivs = Vec_IntSize( p->vDivVars );
    int nConsts = 4;
    int RetValue;

    clk = Abc_Clock();
    //sat_solver_delete_p( &p->pSat );
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;

    assert( nConsts <= 8 );
    clk = Abc_Clock();
    RetValue = Sbd_ManCollectConstantsNew( p->pSat, p->vDivVars, nConsts, PivotVar, Onset, Offset );
    p->timeSat += Abc_Clock() - clk;
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    RetValue = 0;

    // create rows of the table
    nRows = 0;
    for ( i = 0; i < nConsts; i++ )
    for ( k = 0; k < nConsts; k++ )
    {
        Cube = Onset[i] ^ Offset[k];
        assert( Cube );
        nRows = Sbd_ManAddCube1( 256, CoverRows, nRows, Cube );
    }
    assert( nRows <= 64 );
    
    // create columns of the table
    for ( i = 0; i < nRows; i++ )
        for ( k = 0; k <= nDivs; k++ )
            if ( (CoverRows[i] >> k) & 1 )
                Abc_TtXorBit(&CoverCols[k], i);

    // solve the covering problem
    for ( nIters = 0; nIters < nItersMax && nRows < 64; nIters++ )
    {
        if ( p->pPars->fVeryVerbose )
            Sbd_ManMatrPrint( p, CoverCols, nDivs, nRows );

        clk = Abc_Clock();
        if ( !Sbd_ManFindCands( p, CoverCols, nDivs ) )
        {
            if ( p->pPars->fVeryVerbose )
                printf( "Cannot find a feasible cover.\n" );
            p->timeCov += Abc_Clock() - clk;
            return 0;
        }
        p->timeCov += Abc_Clock() - clk;

        if ( p->pPars->fVeryVerbose )
            printf( "Candidate support:  " ),
            Vec_IntPrint( p->vDivSet );

        clk = Abc_Clock();
        *pTruth = Sbd_ManSolve( p->pSat, PivotVar, FreeVar+nIters, p->vDivSet, p->vDivVars, p->vDivValues, p->vLits );
        p->timeSat += Abc_Clock() - clk;

        if ( *pTruth == SBD_SAT_UNDEC )
            printf( "Node %d:  Undecided.\n", Pivot );
        else if ( *pTruth == SBD_SAT_SAT )
        {
            if ( p->pPars->fVeryVerbose )
            {
                int i;
                printf( "Node %d:  SAT.\n", Pivot );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Vec_IntEntry(p->vDivVars, i))) );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%d", i % 10 );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x4) ? '0' + (Vec_IntEntry(p->vDivValues, i) & 1) : 'x' );
                printf( "\n" );
                for ( i = 0; i < nDivs; i++ )
                    printf( "%c", (Vec_IntEntry(p->vDivValues, i) & 0x8) ? '0' + ((Vec_IntEntry(p->vDivValues, i) >> 1) & 1) : 'x' );
                printf( "\n" );
            }
            // add row to the covering table
            for ( i = 0; i < nDivs; i++ )
                if ( Vec_IntEntry(p->vDivValues, i) == 0xE || Vec_IntEntry(p->vDivValues, i) == 0xD )
                    CoverCols[i] |= ((word)1 << nRows);
            CoverCols[nDivs] |= ((word)1 << nRows);
            nRows++;
        }
        else
        {
            if ( p->pPars->fVeryVerbose )
            {
                printf( "Node %d:  UNSAT.   ", Pivot );
                Extra_PrintBinary( stdout, (unsigned *)pTruth, 1 << Vec_IntSize(p->vDivSet) ), printf( "\n" );
            }
            p->nLuts[1]++;
            RetValue = 1;
            break;
        }
    }
    return RetValue;
}